

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O0

QPlatformOpenGLContext * __thiscall
QXcbEglIntegration::createPlatformOpenGLContext(QXcbEglIntegration *this,QOpenGLContext *context)

{
  QSurfaceFormat *glFormat;
  QXcbEglIntegration *in_RDI;
  long in_FS_OFFSET;
  QXcbEglContext *platformContext;
  QXcbScreen *screen;
  QSurfaceFormat *this_00;
  QPlatformOpenGLContext *share;
  QXcbEglContext *in_stack_ffffffffffffffc0;
  QPlatformOpenGLContext local_18 [8];
  QSurfaceFormat local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::screen();
  QScreen::handle();
  glFormat = (QSurfaceFormat *)operator_new(0x78);
  share = local_18;
  QOpenGLContext::format();
  this_00 = local_10;
  QXcbScreen::surfaceFormatFor(this_00);
  QOpenGLContext::shareHandle();
  eglDisplay(in_RDI);
  QXcbEglContext::QXcbEglContext(in_stack_ffffffffffffffc0,glFormat,share,this_00);
  QSurfaceFormat::~QSurfaceFormat(this_00);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)share);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPlatformOpenGLContext *)glFormat;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformOpenGLContext *QXcbEglIntegration::createPlatformOpenGLContext(QOpenGLContext *context) const
{
    QXcbScreen *screen = static_cast<QXcbScreen *>(context->screen()->handle());
    QXcbEglContext *platformContext = new QXcbEglContext(screen->surfaceFormatFor(context->format()),
                                                         context->shareHandle(),
                                                         eglDisplay());
    return platformContext;
}